

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_linkedsectors.cpp
# Opt level: O0

void P_StartLinkedSectorInterpolations
               (TArray<DInterpolation_*,_DInterpolation_*> *list,sector_t_conflict *sector,
               bool ceiling)

{
  uint uVar1;
  sector_t_conflict *psVar2;
  uint uVar3;
  FLinkedSector *pFVar4;
  TArray<FLinkedSector,_FLinkedSector> *local_48;
  DInterpolation *local_40;
  DInterpolation *local_38;
  uint local_2c;
  TArray<FLinkedSector,_FLinkedSector> *pTStack_28;
  uint i;
  plane *scrollplane;
  sector_t_conflict *psStack_18;
  bool ceiling_local;
  sector_t_conflict *sector_local;
  TArray<DInterpolation_*,_DInterpolation_*> *list_local;
  
  if (ceiling) {
    local_48 = &(sector->e->Linked).Ceiling.Sectors;
  }
  else {
    local_48 = (TArray<FLinkedSector,_FLinkedSector> *)&sector->e->Linked;
  }
  pTStack_28 = local_48;
  local_2c = 0;
  scrollplane._7_1_ = ceiling;
  psStack_18 = sector;
  sector_local = (sector_t_conflict *)list;
  while( true ) {
    uVar1 = local_2c;
    uVar3 = TArray<FLinkedSector,_FLinkedSector>::Size(pTStack_28);
    if (uVar3 <= uVar1) break;
    pFVar4 = TArray<FLinkedSector,_FLinkedSector>::operator[](pTStack_28,(ulong)local_2c);
    psVar2 = sector_local;
    if ((pFVar4->Type & 1U) != 0) {
      pFVar4 = TArray<FLinkedSector,_FLinkedSector>::operator[](pTStack_28,(ulong)local_2c);
      local_38 = sector_t::SetInterpolation((sector_t *)pFVar4->Sector,1,false);
      TArray<DInterpolation_*,_DInterpolation_*>::Push
                ((TArray<DInterpolation_*,_DInterpolation_*> *)psVar2,&local_38);
    }
    pFVar4 = TArray<FLinkedSector,_FLinkedSector>::operator[](pTStack_28,(ulong)local_2c);
    psVar2 = sector_local;
    if ((pFVar4->Type & 2U) != 0) {
      pFVar4 = TArray<FLinkedSector,_FLinkedSector>::operator[](pTStack_28,(ulong)local_2c);
      local_40 = sector_t::SetInterpolation((sector_t *)pFVar4->Sector,0,false);
      TArray<DInterpolation_*,_DInterpolation_*>::Push
                ((TArray<DInterpolation_*,_DInterpolation_*> *)psVar2,&local_40);
    }
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void P_StartLinkedSectorInterpolations(TArray<DInterpolation *> &list, sector_t *sector, bool ceiling)
{
	extsector_t::linked::plane &scrollplane = ceiling? sector->e->Linked.Ceiling : sector->e->Linked.Floor;

	for(unsigned i = 0; i < scrollplane.Sectors.Size(); i++)
	{
		if (scrollplane.Sectors[i].Type & LINK_FLOOR)
		{
			list.Push(scrollplane.Sectors[i].Sector->SetInterpolation(sector_t::FloorMove, false));
		}
		if (scrollplane.Sectors[i].Type & LINK_CEILING)
		{
			list.Push(scrollplane.Sectors[i].Sector->SetInterpolation(sector_t::CeilingMove, false));
		}
	}
}